

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinePropertyCommand.cxx
# Opt level: O0

bool __thiscall
cmDefinePropertyCommand::InitialPass
          (cmDefinePropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *poVar4;
  ulong uVar5;
  cmState *this_00;
  char *ShortDescription;
  char *FullDescription;
  allocator local_411;
  string local_410;
  allocator local_3e9;
  string local_3e8;
  allocator local_3c1;
  string local_3c0;
  string local_3a0;
  ostringstream local_380 [8];
  ostringstream e_1;
  uint local_204;
  int local_200;
  uint i;
  Doing doing;
  bool inherited;
  ostringstream local_1d8 [8];
  ostringstream e;
  ScopeType local_60;
  ScopeType scope;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_3_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmDefinePropertyCommand *this_local;
  
  local_28 = param_2;
  param_3_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
  }
  else {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_3_local,0);
    bVar1 = std::operator==(pvVar3,"GLOBAL");
    if (bVar1) {
      local_60 = GLOBAL;
    }
    else {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_3_local,0);
      bVar1 = std::operator==(pvVar3,"DIRECTORY");
      if (bVar1) {
        local_60 = DIRECTORY;
      }
      else {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_3_local,0);
        bVar1 = std::operator==(pvVar3,"TARGET");
        if (bVar1) {
          local_60 = TARGET;
        }
        else {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_3_local,0);
          bVar1 = std::operator==(pvVar3,"SOURCE");
          if (bVar1) {
            local_60 = SOURCE_FILE;
          }
          else {
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_3_local,0);
            bVar1 = std::operator==(pvVar3,"TEST");
            if (bVar1) {
              local_60 = TEST;
            }
            else {
              pvVar3 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_3_local,0);
              bVar1 = std::operator==(pvVar3,"VARIABLE");
              if (bVar1) {
                local_60 = VARIABLE;
              }
              else {
                pvVar3 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)param_3_local,0);
                bVar1 = std::operator==(pvVar3,"CACHED_VARIABLE");
                if (!bVar1) {
                  std::__cxx11::ostringstream::ostringstream(local_1d8);
                  poVar4 = std::operator<<((ostream *)local_1d8,"given invalid scope ");
                  pvVar3 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)param_3_local,0);
                  poVar4 = std::operator<<(poVar4,(string *)pvVar3);
                  poVar4 = std::operator<<(poVar4,".  ");
                  poVar4 = std::operator<<(poVar4,"Valid scopes are ");
                  poVar4 = std::operator<<(poVar4,"GLOBAL, DIRECTORY, TARGET, SOURCE, ");
                  std::operator<<(poVar4,"TEST, VARIABLE, CACHED_VARIABLE.");
                  std::__cxx11::ostringstream::str();
                  cmCommand::SetError(&this->super_cmCommand,(string *)&doing);
                  std::__cxx11::string::~string((string *)&doing);
                  this_local._7_1_ = 0;
                  std::__cxx11::ostringstream::~ostringstream(local_1d8);
                  goto LAB_0067aa19;
                }
                local_60 = CACHED_VARIABLE;
              }
            }
          }
        }
      }
    }
    i._3_1_ = false;
    local_200 = 0;
    for (local_204 = 1;
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_3_local), local_204 < sVar2; local_204 = local_204 + 1) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_3_local,(ulong)local_204);
      bVar1 = std::operator==(pvVar3,"PROPERTY");
      if (bVar1) {
        local_200 = 1;
      }
      else {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_3_local,(ulong)local_204);
        bVar1 = std::operator==(pvVar3,"BRIEF_DOCS");
        if (bVar1) {
          local_200 = 2;
        }
        else {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_3_local,(ulong)local_204);
          bVar1 = std::operator==(pvVar3,"FULL_DOCS");
          if (bVar1) {
            local_200 = 3;
          }
          else {
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_3_local,(ulong)local_204);
            bVar1 = std::operator==(pvVar3,"INHERITED");
            if (bVar1) {
              local_200 = 0;
              i._3_1_ = true;
            }
            else if (local_200 == 1) {
              local_200 = 0;
              pvVar3 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_3_local,(ulong)local_204);
              std::__cxx11::string::operator=((string *)&this->PropertyName,(string *)pvVar3);
            }
            else if (local_200 == 2) {
              pvVar3 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_3_local,(ulong)local_204);
              std::__cxx11::string::operator+=((string *)&this->BriefDocs,(string *)pvVar3);
            }
            else {
              if (local_200 != 3) {
                std::__cxx11::ostringstream::ostringstream(local_380);
                poVar4 = std::operator<<((ostream *)local_380,"given invalid argument \"");
                pvVar3 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)param_3_local,(ulong)local_204);
                poVar4 = std::operator<<(poVar4,(string *)pvVar3);
                std::operator<<(poVar4,"\".");
                std::__cxx11::ostringstream::str();
                cmCommand::SetError(&this->super_cmCommand,&local_3a0);
                std::__cxx11::string::~string((string *)&local_3a0);
                this_local._7_1_ = 0;
                std::__cxx11::ostringstream::~ostringstream(local_380);
                goto LAB_0067aa19;
              }
              pvVar3 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_3_local,(ulong)local_204);
              std::__cxx11::string::operator+=((string *)&this->FullDocs,(string *)pvVar3);
            }
          }
        }
      }
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
          ShortDescription = (char *)std::__cxx11::string::c_str();
          FullDescription = (char *)std::__cxx11::string::c_str();
          cmState::DefineProperty
                    (this_00,&this->PropertyName,local_60,ShortDescription,FullDescription,i._3_1_);
          this_local._7_1_ = 1;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_410,"not given a FULL_DOCS <full-doc> argument.",&local_411);
          cmCommand::SetError(&this->super_cmCommand,&local_410);
          std::__cxx11::string::~string((string *)&local_410);
          std::allocator<char>::~allocator((allocator<char> *)&local_411);
          this_local._7_1_ = 0;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_3e8,"not given a BRIEF_DOCS <brief-doc> argument.",&local_3e9);
        cmCommand::SetError(&this->super_cmCommand,&local_3e8);
        std::__cxx11::string::~string((string *)&local_3e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
        this_local._7_1_ = 0;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3c0,"not given a PROPERTY <name> argument.",&local_3c1);
      cmCommand::SetError(&this->super_cmCommand,&local_3c0);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
      this_local._7_1_ = 0;
    }
  }
LAB_0067aa19:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmDefinePropertyCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1)
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // Get the scope in which to define the property.
  cmProperty::ScopeType scope;
  if(args[0] == "GLOBAL")
    {
    scope = cmProperty::GLOBAL;
    }
  else if(args[0] == "DIRECTORY")
    {
    scope = cmProperty::DIRECTORY;
    }
  else if(args[0] == "TARGET")
    {
    scope = cmProperty::TARGET;
    }
  else if(args[0] == "SOURCE")
    {
    scope = cmProperty::SOURCE_FILE;
    }
  else if(args[0] == "TEST")
    {
    scope = cmProperty::TEST;
    }
  else if(args[0] == "VARIABLE")
    {
    scope = cmProperty::VARIABLE;
    }
  else if (args[0] == "CACHED_VARIABLE")
    {
    scope = cmProperty::CACHED_VARIABLE;
    }
  else
    {
    std::ostringstream e;
    e << "given invalid scope " << args[0] << ".  "
      << "Valid scopes are "
      << "GLOBAL, DIRECTORY, TARGET, SOURCE, "
      << "TEST, VARIABLE, CACHED_VARIABLE.";
    this->SetError(e.str());
    return false;
    }

  // Parse remaining arguments.
  bool inherited = false;
  enum Doing { DoingNone, DoingProperty, DoingBrief, DoingFull };
  Doing doing = DoingNone;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    if(args[i] == "PROPERTY")
      {
      doing = DoingProperty;
      }
    else if(args[i] == "BRIEF_DOCS")
      {
      doing = DoingBrief;
      }
    else if(args[i] == "FULL_DOCS")
      {
      doing = DoingFull;
      }
    else if(args[i] == "INHERITED")
      {
      doing = DoingNone;
      inherited = true;
      }
    else if(doing == DoingProperty)
      {
      doing = DoingNone;
      this->PropertyName = args[i];
      }
    else if(doing == DoingBrief)
      {
      this->BriefDocs += args[i];
      }
    else if(doing == DoingFull)
      {
      this->FullDocs += args[i];
      }
    else
      {
      std::ostringstream e;
      e << "given invalid argument \"" << args[i] << "\".";
      this->SetError(e.str());
      return false;
      }
    }

  // Make sure a property name was found.
  if(this->PropertyName.empty())
    {
    this->SetError("not given a PROPERTY <name> argument.");
    return false;
    }

  // Make sure documentation was given.
  if(this->BriefDocs.empty())
    {
    this->SetError("not given a BRIEF_DOCS <brief-doc> argument.");
    return false;
    }
  if(this->FullDocs.empty())
    {
    this->SetError("not given a FULL_DOCS <full-doc> argument.");
    return false;
    }

  // Actually define the property.
  this->Makefile->GetState()->DefineProperty
    (this->PropertyName, scope,
     this->BriefDocs.c_str(), this->FullDocs.c_str(), inherited);

  return true;
}